

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::LowMidHighCloudGroup>
metaf::LowMidHighCloudGroup::parse
          (string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  LowLayer LVar2;
  MidLayer MVar3;
  HighLayer HVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  optional<metaf::LowMidHighCloudGroup> oVar9;
  smatch match;
  string_type local_40;
  
  if (parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
      rgx_abi_cxx11_ == '\0') {
    iVar5 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                 ::rgx_abi_cxx11_);
    if (iVar5 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::rgx_abi_cxx11_,"8/([0-9/])([0-9/])([0-9/])",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                    ::rgx_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                           ::rgx_abi_cxx11_);
    }
  }
  if (reportPart == RMK) {
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    match._M_begin._M_current = (char *)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (group,&match,
                       &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                        ::rgx_abi_cxx11_,0);
    if (bVar1) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_40,&match,1);
      LVar2 = lowLayerFromChar(*local_40._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_40,&match,2);
      MVar3 = midLayerFromChar(*local_40._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_40,&match,3);
      HVar4 = highLayerFromChar(*local_40._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_40);
      uVar8 = (ulong)HVar4 | 0x100000000;
      uVar7 = (ulong)MVar3 << 0x20;
      uVar6 = (ulong)LVar2;
    }
    else {
      uVar8 = 0;
      uVar6 = 0;
      uVar7 = 0;
    }
    uVar6 = uVar6 | uVar7;
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&match);
  }
  else {
    uVar8 = 0;
    uVar6 = 0;
  }
  oVar9.super__Optional_base<metaf::LowMidHighCloudGroup,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::LowMidHighCloudGroup>._8_8_ = uVar8;
  oVar9.super__Optional_base<metaf::LowMidHighCloudGroup,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::LowMidHighCloudGroup>._M_payload._0_8_ = uVar6;
  return (optional<metaf::LowMidHighCloudGroup>)
         oVar9.super__Optional_base<metaf::LowMidHighCloudGroup,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::LowMidHighCloudGroup>;
}

Assistant:

std::optional<LowMidHighCloudGroup> LowMidHighCloudGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	std::optional<LowMidHighCloudGroup> notRecognised;
	static const std::regex rgx("8/([0-9/])([0-9/])([0-9/])");
	static const auto matchLowLayer = 1, matchMidLayer = 2, matchHighLayer = 3;

	if (reportPart != ReportPart::RMK) return notRecognised;
	std::smatch match;
	if (!std::regex_match(group, match, rgx)) return notRecognised;

	const auto lowLayer = lowLayerFromChar(match.str(matchLowLayer)[0]);
	const auto midLayer = midLayerFromChar(match.str(matchMidLayer)[0]);
	const auto highLayer = highLayerFromChar(match.str(matchHighLayer)[0]);
	LowMidHighCloudGroup result;
	result.cloudLowLayer = lowLayer;
	result.cloudMidLayer = midLayer;
	result.cloudHighLayer = highLayer;
	return result;
}